

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sift_test.cpp
# Opt level: O2

double ComputeRecall(uint32_t num,int K,int *gt,
                    vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                    *points)

{
  pointer pvVar1;
  pointer ppVar2;
  undefined1 auVar3 [16];
  size_type sVar4;
  pair<unsigned_int,_float> *p;
  pointer __x;
  int j;
  ulong uVar5;
  int iVar6;
  undefined1 in_ZMM1 [64];
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> label;
  uint local_84;
  ulong local_80;
  long local_78;
  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  *local_70;
  ulong local_68;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_60;
  
  local_68 = (ulong)num;
  iVar6 = 0;
  local_78 = (long)K << 2;
  local_70 = points;
  for (local_80 = 0; local_80 != local_68; local_80 = local_80 + 1) {
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    for (uVar5 = 0; (uint)(~(K >> 0x1f) & K) != uVar5; uVar5 = uVar5 + 1) {
      local_84 = gt[uVar5];
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::_M_insert_unique<unsigned_int>(&local_60,&local_84);
    }
    pvVar1 = (local_70->
             super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    ppVar2 = *(pointer *)
              ((long)&pvVar1[local_80].
                      super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                      ._M_impl.super__Vector_impl_data + 8);
    for (__x = pvVar1[local_80].
               super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
               ._M_impl.super__Vector_impl_data._M_start; __x != ppVar2; __x = __x + 1) {
      sVar4 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::count
                        ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)&local_60,&__x->first);
      iVar6 = (iVar6 + 1) - (uint)(sVar4 == 0);
    }
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&local_60);
    gt = (int *)((long)gt + local_78);
  }
  auVar3 = vcvtusi2sd_avx512f(in_ZMM1._0_16_,K * num);
  return (double)iVar6 / auVar3._0_8_;
}

Assistant:

double ComputeRecall(uint32_t num, int K, const int *gt, const std::vector<PointSet> &points) {
  int recalls = 0;
  for (size_t i = 0; i < num; i++) {
    std::set<uint32_t> label;
    for (int j = 0; j < K; j++) {
      label.insert(gt[i * K + j]);
    }
    for (const auto &p : points[i]) {
      if (label.count(p.first) != 0) {
        recalls += 1;
      }
    }
  }

  return 1.0 * recalls / (num * K);
}